

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlSchemaFreeValidCtxt(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlSchemaValidCtxtPyCtxtPtr local_40;
  undefined *local_38;
  PyObject *pyobj_ctxt;
  xmlSchemaValidCtxtPyCtxtPtr pyCtxt;
  xmlSchemaValidCtxtPtr ctxt;
  PyObject *args_local;
  PyObject *self_local;
  
  ctxt = (xmlSchemaValidCtxtPtr)args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlSchemaFreeValidCtxt",&local_38);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (local_38 == &_Py_NoneStruct) {
      local_40 = (xmlSchemaValidCtxtPyCtxtPtr)0x0;
    }
    else {
      local_40 = *(xmlSchemaValidCtxtPyCtxtPtr *)(local_38 + 0x10);
    }
    pyCtxt = local_40;
    iVar1 = xmlSchemaGetValidErrors(local_40,0,0,&pyobj_ctxt);
    if ((iVar1 == 0) && (pyobj_ctxt != (PyObject *)0x0)) {
      _Py_XDECREF((PyObject *)pyobj_ctxt->ob_type);
      _Py_XDECREF((PyObject *)pyobj_ctxt->ob_refcnt);
      _Py_XDECREF((PyObject *)pyobj_ctxt[1].ob_refcnt);
      (*_xmlFree)(pyobj_ctxt);
    }
    xmlSchemaFreeValidCtxt(pyCtxt);
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlSchemaFreeValidCtxt(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
	xmlSchemaValidCtxtPtr ctxt;
	xmlSchemaValidCtxtPyCtxtPtr pyCtxt;
	PyObject *pyobj_ctxt;

	if (!PyArg_ParseTuple(args, (char *)"O:xmlSchemaFreeValidCtxt", &pyobj_ctxt))
		return(NULL);
	ctxt = (xmlSchemaValidCtxtPtr) PySchemaValidCtxt_Get(pyobj_ctxt);

	if (xmlSchemaGetValidErrors(ctxt, NULL, NULL, (void **) &pyCtxt) == 0)
	{
		if (pyCtxt != NULL)
		{
			Py_XDECREF(pyCtxt->error);
			Py_XDECREF(pyCtxt->warn);
			Py_XDECREF(pyCtxt->arg);
			xmlFree(pyCtxt);
		}
	}

	xmlSchemaFreeValidCtxt(ctxt);
	Py_INCREF(Py_None);
	return(Py_None);
}